

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenio::load_node_call(tetgenio *this,FILE *infile,int markers,int uvflag,char *infilename)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *result;
  double *pdVar4;
  int *piVar5;
  pointparam *ppVar6;
  long lVar7;
  undefined4 in_register_0000000c;
  pointparam *infilename_00;
  tetgenio *this_00;
  char *__format;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  char *stringptr;
  char inputline [2048];
  tetgenio *local_870;
  int local_868;
  int local_864;
  long local_860;
  pointparam *local_858;
  double local_850;
  FILE *local_848;
  double local_840;
  char local_838 [2056];
  
  infilename_00 = (pointparam *)CONCAT44(in_register_0000000c,uvflag);
  iVar10 = this->numberofpoints;
  uVar8 = (ulong)iVar10;
  this_00 = (tetgenio *)(uVar8 * 0x18);
  if ((long)uVar8 < 0) {
    this_00 = (tetgenio *)0xffffffffffffffff;
  }
  local_868 = markers;
  local_864 = uvflag;
  local_848 = infile;
  pdVar4 = (double *)operator_new__((ulong)this_00);
  this->pointlist = pdVar4;
  if (0 < this->numberofpointattributes) {
    iVar3 = this->numberofpointattributes * iVar10;
    this_00 = (tetgenio *)((long)iVar3 * 8);
    if (iVar3 < 0) {
      this_00 = (tetgenio *)0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__((ulong)this_00);
    this->pointattributelist = pdVar4;
  }
  if (local_868 != 0) {
    this_00 = (tetgenio *)0xffffffffffffffff;
    if (-1 < iVar10) {
      this_00 = (tetgenio *)(uVar8 * 4);
    }
    piVar5 = (int *)operator_new__((ulong)this_00);
    this->pointmarkerlist = piVar5;
  }
  if (local_864 != 0) {
    infilename_00 = (pointparam *)0x18;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    this_00 = (tetgenio *)0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      this_00 = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    ppVar6 = (pointparam *)operator_new__((ulong)this_00);
    this->pointparamlist = ppVar6;
  }
  if (this->numberofpoints < 1) {
    lVar11 = 0;
  }
  else {
    local_858 = (pointparam *)0x0;
    lVar11 = 0;
    lVar9 = 0;
    do {
      local_870 = (tetgenio *)readnumberline(this_00,local_838,local_848,(char *)infilename_00);
      if (this->useindex != 0) {
        if (lVar11 == 0) {
          lVar7 = strtol((char *)local_870,(char **)&local_870,0);
          if ((uint)lVar7 < 2) {
            this->firstnumber = (uint)lVar7;
          }
        }
        while ((uVar8 = (ulong)(byte)local_870->firstnumber, 0x2c < uVar8 ||
               ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
          local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
        }
        do {
          bVar1 = (byte)local_870->firstnumber;
          uVar8 = (ulong)bVar1;
          if (uVar8 < 0x2f) {
            if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) break;
            if (uVar8 == 0x23) {
              *(char *)&local_870->firstnumber = '\0';
              break;
            }
          }
          if (0xf5 < (byte)(bVar1 - 0x3a)) break;
          local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
        } while( true );
      }
      iVar10 = (int)lVar11;
      if ((char)local_870->firstnumber == '\0') {
        uVar8 = (ulong)(uint)(this->firstnumber + iVar10);
        __format = "Error:  Point %d has no x coordinate.\n";
        goto LAB_0010de7a;
      }
      dVar12 = strtod((char *)local_870,(char **)&local_870);
      this_00 = local_870;
      while ((uVar8 = (ulong)(byte)this_00->firstnumber, 0x2c < uVar8 ||
             ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
        this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
      }
LAB_0010daa2:
      bVar1 = (byte)this_00->firstnumber;
      uVar8 = (ulong)bVar1;
      if (0x2e < uVar8) {
LAB_0010dab7:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dac2;
        this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
        goto LAB_0010daa2;
      }
      if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dac2;
      if (uVar8 != 0x23) goto LAB_0010dab7;
      *(undefined1 *)&this_00->firstnumber = 0;
LAB_0010dac2:
      local_870 = this_00;
      if ((char)this_00->firstnumber == '\0') {
        uVar8 = (ulong)(uint)(this->firstnumber + iVar10);
        __format = "Error:  Point %d has no y coordinate.\n";
LAB_0010de7a:
        printf(__format,uVar8);
        break;
      }
      local_840 = dVar12;
      dVar12 = strtod((char *)this_00,(char **)&local_870);
      dVar13 = 0.0;
      if (this->mesh_dim == 3) {
        while ((this_00 = local_870, uVar8 = (ulong)(byte)this_00->firstnumber, 0x2c < uVar8 ||
               ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
          local_870 = (tetgenio *)((long)&this_00->firstnumber + 1);
        }
LAB_0010db06:
        bVar1 = (byte)this_00->firstnumber;
        uVar8 = (ulong)bVar1;
        if (0x2e < uVar8) {
LAB_0010db1b:
          if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010db26;
          this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
          goto LAB_0010db06;
        }
        if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010db26;
        if (uVar8 != 0x23) goto LAB_0010db1b;
        *(undefined1 *)&this_00->firstnumber = 0;
LAB_0010db26:
        local_870 = this_00;
        if ((char)this_00->firstnumber == '\0') {
          uVar8 = (ulong)(uint)(this->firstnumber + iVar10);
          __format = "Error:  Point %d has no z coordinate.\n";
          goto LAB_0010de7a;
        }
        local_850 = dVar12;
        dVar13 = strtod((char *)this_00,(char **)&local_870);
        dVar12 = local_850;
      }
      pdVar4 = this->pointlist;
      pdVar4[(long)local_858] = local_840;
      pdVar4[(long)((long)local_858->uv + 1)] = dVar12;
      pdVar4[(long)((long)local_858->uv + 2)] = dVar13;
      infilename_00 = local_858;
      local_860 = lVar11;
      if (0 < this->numberofpointattributes) {
        lVar9 = (long)(int)lVar9;
        iVar10 = 0;
        do {
          while ((this_00 = local_870, uVar8 = (ulong)(byte)this_00->firstnumber, 0x2c < uVar8 ||
                 ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
            local_870 = (tetgenio *)((long)&this_00->firstnumber + 1);
          }
LAB_0010db95:
          bVar1 = (byte)this_00->firstnumber;
          uVar8 = (ulong)bVar1;
          if (0x2e < uVar8) {
LAB_0010dbaa:
            if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dbb5;
            this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
            goto LAB_0010db95;
          }
          if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dbb5;
          if (uVar8 != 0x23) goto LAB_0010dbaa;
          *(undefined1 *)&this_00->firstnumber = 0;
LAB_0010dbb5:
          local_870 = this_00;
          if ((char)this_00->firstnumber == '\0') {
            dVar12 = 0.0;
          }
          else {
            dVar12 = strtod((char *)this_00,(char **)&local_870);
          }
          this->pointattributelist[lVar9] = dVar12;
          lVar9 = lVar9 + 1;
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->numberofpointattributes);
      }
      lVar11 = local_860;
      if (local_868 != 0) {
        while ((this_00 = local_870, uVar8 = (ulong)(byte)this_00->firstnumber, 0x2c < uVar8 ||
               ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
          local_870 = (tetgenio *)((long)&this_00->firstnumber + 1);
        }
LAB_0010dc0a:
        bVar1 = (byte)this_00->firstnumber;
        uVar8 = (ulong)bVar1;
        if (0x2e < uVar8) {
LAB_0010dc1f:
          if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dc2a;
          this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
          goto LAB_0010dc0a;
        }
        if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dc2a;
        if (uVar8 != 0x23) goto LAB_0010dc1f;
        *(undefined1 *)&this_00->firstnumber = 0;
LAB_0010dc2a:
        local_870 = this_00;
        if ((char)this_00->firstnumber == '\0') {
          iVar10 = 0;
        }
        else {
          lVar7 = strtol((char *)this_00,(char **)&local_870,0);
          iVar10 = (int)lVar7;
        }
        infilename_00 = (pointparam *)this->pointmarkerlist;
        *(int *)((long)infilename_00->uv + lVar11 * 4) = iVar10;
      }
      if (local_864 != 0) {
        while ((uVar8 = (ulong)(byte)local_870->firstnumber, 0x2c < uVar8 ||
               ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
          local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
        }
LAB_0010dc71:
        bVar1 = (byte)local_870->firstnumber;
        uVar8 = (ulong)bVar1;
        if (0x2e < uVar8) {
LAB_0010dc86:
          if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dc91;
          local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
          goto LAB_0010dc71;
        }
        if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dc91;
        if (uVar8 != 0x23) goto LAB_0010dc86;
        *(undefined1 *)&local_870->firstnumber = 0;
LAB_0010dc91:
        if ((char)local_870->firstnumber == '\0') {
          uVar8 = (ulong)(uint)(this->firstnumber + (int)lVar11);
          __format = "Error:  Point %d has no uv[0].\n";
        }
        else {
          dVar12 = strtod((char *)local_870,(char **)&local_870);
          this->pointparamlist[lVar11].uv[0] = dVar12;
          while ((uVar8 = (ulong)(byte)local_870->firstnumber, 0x2c < uVar8 ||
                 ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
            local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
          }
LAB_0010dcd1:
          bVar1 = (byte)local_870->firstnumber;
          uVar8 = (ulong)bVar1;
          if (0x2e < uVar8) {
LAB_0010dce6:
            if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dcf1;
            local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
            goto LAB_0010dcd1;
          }
          if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dcf1;
          if (uVar8 != 0x23) goto LAB_0010dce6;
          *(undefined1 *)&local_870->firstnumber = 0;
LAB_0010dcf1:
          if ((char)local_870->firstnumber == '\0') {
            uVar8 = (ulong)(uint)(this->firstnumber + (int)local_860);
            __format = "Error:  Point %d has no uv[1].\n";
            lVar11 = local_860;
          }
          else {
            dVar12 = strtod((char *)local_870,(char **)&local_870);
            this->pointparamlist[lVar11].uv[1] = dVar12;
            while ((uVar8 = (ulong)(byte)local_870->firstnumber, 0x2c < uVar8 ||
                   ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
              local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
            }
LAB_0010dd2e:
            bVar1 = (byte)local_870->firstnumber;
            uVar8 = (ulong)bVar1;
            if (0x2e < uVar8) {
LAB_0010dd43:
              if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010dd4e;
              local_870 = (tetgenio *)((long)&local_870->firstnumber + 1);
              goto LAB_0010dd2e;
            }
            if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010dd4e;
            if (uVar8 != 0x23) goto LAB_0010dd43;
            *(undefined1 *)&local_870->firstnumber = 0;
LAB_0010dd4e:
            if ((char)local_870->firstnumber == '\0') {
              uVar8 = (ulong)(uint)(this->firstnumber + (int)local_860);
              __format = "Error:  Point %d has no tag.\n";
              lVar11 = local_860;
            }
            else {
              lVar7 = strtol((char *)local_870,(char **)&local_870,0);
              this->pointparamlist[lVar11].tag = (int)lVar7;
              this_00 = local_870;
              while ((uVar8 = (ulong)(byte)this_00->firstnumber, 0x2c < uVar8 ||
                     ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
                this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
              }
LAB_0010dd8b:
              bVar1 = (byte)this_00->firstnumber;
              uVar8 = (ulong)bVar1;
              if (0x2e < uVar8) {
LAB_0010dda0:
                if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010ddab;
                this_00 = (tetgenio *)((long)&this_00->firstnumber + 1);
                goto LAB_0010dd8b;
              }
              if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010ddab;
              if (uVar8 != 0x23) goto LAB_0010dda0;
              *(undefined1 *)&this_00->firstnumber = 0;
LAB_0010ddab:
              local_870 = this_00;
              if ((char)this_00->firstnumber == '\0') {
                uVar8 = (ulong)(uint)(this->firstnumber + (int)local_860);
                __format = "Error:  Point %d has no type.\n";
                lVar11 = local_860;
              }
              else {
                lVar7 = strtol((char *)this_00,(char **)&local_870,0);
                infilename_00 = this->pointparamlist;
                infilename_00[lVar11].type = (uint)lVar7;
                lVar11 = local_860;
                if ((uint)lVar7 < 3) goto LAB_0010ddda;
                uVar8 = (ulong)(uint)(this->firstnumber + (int)local_860);
                __format = "Error:  Point %d has an invalid type.\n";
              }
            }
          }
        }
        goto LAB_0010de7a;
      }
LAB_0010ddda:
      local_858 = (pointparam *)((long)local_858->uv + 3);
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->numberofpoints);
  }
  iVar10 = this->numberofpoints;
  if ((int)lVar11 < iVar10) {
    if (this->pointlist != (double *)0x0) {
      operator_delete__(this->pointlist);
    }
    this->pointlist = (double *)0x0;
    if (local_868 != 0) {
      if (this->pointmarkerlist != (int *)0x0) {
        operator_delete__(this->pointmarkerlist);
      }
      this->pointmarkerlist = (int *)0x0;
    }
    if (0 < this->numberofpointattributes) {
      if (this->pointattributelist != (double *)0x0) {
        operator_delete__(this->pointattributelist);
      }
      this->pointattributelist = (double *)0x0;
    }
    if (local_864 != 0) {
      if (this->pointparamlist != (pointparam *)0x0) {
        operator_delete__(this->pointparamlist);
      }
      this->pointparamlist = (pointparam *)0x0;
    }
    this->numberofpoints = 0;
  }
  return iVar10 <= (int)lVar11;
}

Assistant:

bool tetgenio::load_node_call(FILE* infile, int markers, int uvflag, 
                              char* infilename)
{
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL x, y, z, attrib;
  int firstnode, currentmarker;
  int index, attribindex;
  int i, j;

  // Initialize 'pointlist', 'pointattributelist', and 'pointmarkerlist'.
  pointlist = new REAL[numberofpoints * 3];
  if (pointlist == (REAL *) NULL) {
    terminatetetgen(NULL, 1);
  }
  if (numberofpointattributes > 0) {
    pointattributelist = new REAL[numberofpoints * numberofpointattributes];
    if (pointattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (markers) {
    pointmarkerlist = new int[numberofpoints];
    if (pointmarkerlist == (int *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }
  if (uvflag) {
    pointparamlist = new pointparam[numberofpoints];
    if (pointparamlist == NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the point section.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberofpoints; i++) {
    stringptr = readnumberline(inputline, infile, infilename);
    if (useindex) {
      if (i == 0) {
        firstnode = (int) strtol (stringptr, &stringptr, 0);
        if ((firstnode == 0) || (firstnode == 1)) {
          firstnumber = firstnode;
        }
      }
      stringptr = findnextnumber(stringptr);
    } // if (useindex)
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no x coordinate.\n", firstnumber + i);
      break;
    }
    x = (REAL) strtod(stringptr, &stringptr);
    stringptr = findnextnumber(stringptr);
    if (*stringptr == '\0') {
      printf("Error:  Point %d has no y coordinate.\n", firstnumber + i);
      break;
    }
    y = (REAL) strtod(stringptr, &stringptr);
    if (mesh_dim == 3) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no z coordinate.\n", firstnumber + i);
        break;
      }
      z = (REAL) strtod(stringptr, &stringptr);
    } else {
      z = 0.0; // mesh_dim == 2;
    }
    pointlist[index++] = x;
    pointlist[index++] = y;
    pointlist[index++] = z;
    // Read the point attributes.
    for (j = 0; j < numberofpointattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      pointattributelist[attribindex++] = attrib;
    }
    if (markers) {
      // Read a point marker.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        currentmarker = 0;
      } else {
        currentmarker = (int) strtol (stringptr, &stringptr, 0);
      }
      pointmarkerlist[i] = currentmarker;
    }
    if (uvflag) {
      // Read point paramteters.
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[0].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[0] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no uv[1].\n", firstnumber + i);
        break;
      }
      pointparamlist[i].uv[1] = (REAL) strtod(stringptr, &stringptr);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no tag.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].tag = (int) strtol (stringptr, &stringptr, 0);
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Point %d has no type.\n", firstnumber + i);
        break;
      }
      pointparamlist[i].type = (int) strtol (stringptr, &stringptr, 0);
      if ((pointparamlist[i].type < 0) || (pointparamlist[i].type > 2)) {
        printf("Error:  Point %d has an invalid type.\n", firstnumber + i);
        break;
      }
    }
  }
  if (i < numberofpoints) {
    // Failed to read points due to some error.
    delete [] pointlist;
    pointlist = (REAL *) NULL;
    if (markers) {
      delete [] pointmarkerlist;
      pointmarkerlist = (int *) NULL;
    }
    if (numberofpointattributes > 0) {
      delete [] pointattributelist;
      pointattributelist = (REAL *) NULL;
    }
    if (uvflag) {
      delete [] pointparamlist;
      pointparamlist = NULL;
    }
    numberofpoints = 0;
    return false;
  }
  return true;
}